

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

Span<Potassco::WeightLit_t> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<Potassco::WeightLit_t>
          (SmData *this,Span<Potassco::WeightLit_t> *in,
          vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *out)

{
  pointer pWVar1;
  WeightLit_t WVar2;
  pointer pWVar3;
  uint uVar4;
  WeightLit_t in_RAX;
  Atom *pAVar5;
  pointer pWVar6;
  Atom_t AVar7;
  Atom_t a;
  WeightLit_t *pWVar8;
  Span<Potassco::WeightLit_t> SVar9;
  WeightLit_t local_38;
  
  pWVar1 = (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
      _M_impl.super__Vector_impl_data._M_finish != pWVar1) {
    (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>)._M_impl
    .super__Vector_impl_data._M_finish = pWVar1;
  }
  if (in->size != 0) {
    pWVar8 = in->first;
    local_38 = in_RAX;
    do {
      WVar2 = *pWVar8;
      AVar7 = WVar2.lit;
      a = -AVar7;
      if (0 < (int)AVar7) {
        a = AVar7;
      }
      pAVar5 = mapAtom(this,a);
      uVar4 = -((uint)*pAVar5 & 0xfffffff);
      if (-1 < (int)AVar7) {
        uVar4 = (uint)*pAVar5 & 0xfffffff;
      }
      local_38 = (WeightLit_t)((ulong)uVar4 | (ulong)WVar2 & 0xffffffff00000000);
      std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
      emplace_back<Potassco::WeightLit_t>(out,&local_38);
      pWVar8 = pWVar8 + 1;
    } while (pWVar8 != in->first + in->size);
  }
  pWVar1 = (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pWVar3 = (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pWVar6 = (pointer)((long)pWVar3 - (long)pWVar1 >> 3);
  if (pWVar3 == pWVar1) {
    pWVar6 = (pointer)0x0;
    pWVar1 = (pointer)0x0;
  }
  SVar9.size = (size_t)pWVar6;
  SVar9.first = pWVar1;
  return SVar9;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}